

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QGles2GraphicsPipeline::destroy(QGles2GraphicsPipeline *this)

{
  long lVar1;
  QList<QRhiGles2::DeferredReleaseEntry> *in_RDI;
  long in_FS_OFFSET;
  QRhiGles2 *rhiD;
  DeferredReleaseEntry e;
  QRhiResource *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&in_RDI[0x24].d.d != 0) {
    *(undefined4 *)&in_RDI[0x24].d.d = 0;
    QVLABase<QGles2UniformDescription>::clear
              ((QVLABase<QGles2UniformDescription> *)&in_RDI[0x24].d.ptr);
    QVLABase<QGles2SamplerDescription>::clear
              ((QVLABase<QGles2SamplerDescription> *)&in_RDI[0x2d].d.ptr);
    if ((in_RDI->d).ptr != (DeferredReleaseEntry *)0x0) {
      QList<QRhiGles2::DeferredReleaseEntry>::append
                (in_RDI,(parameter_type)in_stack_ffffffffffffffc8);
      QRhiImplementation::unregisterResource
                ((QRhiImplementation *)0x930f92,in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGles2GraphicsPipeline::destroy()
{
    if (!program)
        return;

    QRhiGles2::DeferredReleaseEntry e;
    e.type = QRhiGles2::DeferredReleaseEntry::Pipeline;

    e.pipeline.program = program;

    program = 0;
    uniforms.clear();
    samplers.clear();

    QRHI_RES_RHI(QRhiGles2);
    if (rhiD) {
        rhiD->releaseQueue.append(e);
        rhiD->unregisterResource(this);
    }
}